

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CServer::Kick(CServer *this,int ClientID,char *pReason)

{
  IConsole *pIVar1;
  undefined8 in_RDX;
  int in_ESI;
  CServer *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((in_ESI < 0) || (0x3f < in_ESI)) || (in_RDI->m_aClients[in_ESI].m_State == 0)) {
    pIVar1 = Console(in_RDI);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])
              (pIVar1,0,"server","invalid client id to kick");
  }
  else if (in_RDI->m_RconClientID == in_ESI) {
    pIVar1 = Console(in_RDI);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])
              (pIVar1,0,"server","you can\'t kick yourself");
  }
  else if (in_RDI->m_RconAuthLevel < in_RDI->m_aClients[in_ESI].m_Authed) {
    pIVar1 = Console(in_RDI);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,0,"server","kick command denied");
  }
  else {
    CNetServer::Drop((CNetServer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),(char *)in_RDI);
  }
  return;
}

Assistant:

void CServer::Kick(int ClientID, const char *pReason)
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CClient::STATE_EMPTY)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "invalid client id to kick");
		return;
	}
	else if(m_RconClientID == ClientID)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "you can't kick yourself");
 		return;
	}
	else if(m_aClients[ClientID].m_Authed > m_RconAuthLevel)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "kick command denied");
 		return;
	}

	m_NetServer.Drop(ClientID, pReason);
}